

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_matcher.hpp
# Opt level: O0

void __thiscall PathMatcher<int>::Path::~Path(Path *this)

{
  Path *this_00;
  size_type sVar1;
  reference ppPVar2;
  ulong local_18;
  size_t i;
  Path *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>::size
                      (&this->children);
    if (sVar1 <= local_18) break;
    ppPVar2 = std::vector<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>::
              operator[](&this->children,local_18);
    this_00 = *ppPVar2;
    if (this_00 != (Path *)0x0) {
      ~Path(this_00);
      operator_delete(this_00,0x28);
    }
    local_18 = local_18 + 1;
  }
  std::vector<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>::~vector
            (&this->children);
  return;
}

Assistant:

~Path() {
            for(size_t i = 0; i < children.size(); i++) {
                delete children[i];
            }
        }